

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::emplace_back<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,Frame *args)

{
  size_type sVar1;
  pointer pFVar2;
  
  if (this->len == this->cap) {
    pFVar2 = emplaceRealloc<slang::ast::EvalContext::Frame>(this,this->data_ + this->len,args);
    return pFVar2;
  }
  ast::EvalContext::Frame::Frame(this->data_ + this->len,args);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }